

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA
          (VariationalBayesEstimatorOnLDA *this,BOWFileParser *parser,uint K,
          double convergenceDiterminationRate)

{
  uint uVar1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar2;
  uint *puVar3;
  size_type sVar4;
  ulong uVar5;
  allocator<std::vector<double,_std::allocator<double>_>_> local_42;
  allocator<std::vector<double,_std::allocator<double>_>_> local_41;
  allocator<double> local_40;
  allocator<double> local_3f;
  allocator<std::vector<double,_std::allocator<double>_>_> local_3e;
  allocator<std::vector<double,_std::allocator<double>_>_> local_3d [20];
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_29;
  double local_28;
  double convergenceDiterminationRate_local;
  BOWFileParser *pBStack_18;
  uint K_local;
  BOWFileParser *parser_local;
  VariationalBayesEstimatorOnLDA *this_local;
  
  this->_vptr_VariationalBayesEstimatorOnLDA =
       (_func_int **)&PTR__VariationalBayesEstimatorOnLDA_0014baa0;
  local_28 = convergenceDiterminationRate;
  convergenceDiterminationRate_local._4_4_ = K;
  pBStack_18 = parser;
  parser_local = (BOWFileParser *)this;
  pvVar2 = BOWFileParser::getFrequencyMatrix(parser);
  this->_frequencyMatrix = pvVar2;
  pvVar2 = BOWFileParser::getDocVoca(pBStack_18);
  this->_docVoca = pvVar2;
  this->_K = convergenceDiterminationRate_local._4_4_;
  puVar3 = BOWFileParser::getV(pBStack_18);
  this->_V = *puVar3;
  sVar4 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(this->_frequencyMatrix);
  this->_D = (uint)sVar4;
  this->_convergenceDiterminationRate = local_28;
  uVar1 = this->_D;
  std::
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::allocator(&local_29);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->_qz,(ulong)uVar1,&local_29);
  std::
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::~allocator(&local_29);
  uVar1 = this->_D;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(local_3d);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_thetaEx,(ulong)uVar1,local_3d);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(local_3d);
  uVar5 = (ulong)convergenceDiterminationRate_local._4_4_;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_3e);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_phiEx,uVar5,&local_3e);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_3e);
  std::vector<double,_std::allocator<double>_>::vector(&this->_alpha);
  std::vector<double,_std::allocator<double>_>::vector(&this->_beta);
  this->_alphaSum = 0.0;
  this->_betaSum = 0.0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_alphaTimeSeries);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_betaTimeSeries);
  uVar1 = this->_D;
  std::allocator<double>::allocator(&local_3f);
  std::vector<double,_std::allocator<double>_>::vector(&this->_nd,(ulong)uVar1,&local_3f);
  std::allocator<double>::~allocator(&local_3f);
  uVar5 = (ulong)convergenceDiterminationRate_local._4_4_;
  std::allocator<double>::allocator(&local_40);
  std::vector<double,_std::allocator<double>_>::vector(&this->_nk,uVar5,&local_40);
  std::allocator<double>::~allocator(&local_40);
  uVar1 = this->_D;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_41);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_ndk,(ulong)uVar1,&local_41);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_41);
  uVar5 = (ulong)convergenceDiterminationRate_local._4_4_;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_42);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_nkv,uVar5,&local_42);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_42);
  std::vector<double,_std::allocator<double>_>::vector(&this->_VLBTimeSeries);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[3])();
  (*this->_vptr_VariationalBayesEstimatorOnLDA[2])();
  return;
}

Assistant:

VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA(const BOWFileParser &parser, const unsigned int K, const double convergenceDiterminationRate)//{{{
    :_frequencyMatrix(parser.getFrequencyMatrix()),
     _docVoca(parser.getDocVoca()),
     _D(_frequencyMatrix.size()),
     _K(K),
     _V(parser.getV()),
     _qz(_D),
     _convergenceDiterminationRate(convergenceDiterminationRate),
     _thetaEx(_D),
     _phiEx(K),
     _alphaSum(0),
     _betaSum(0),
     _nk(K),
     _nd(_D),
     _nkv(K),
     _ndk(_D){
    this->initializeParam();
    this->initializeHyperParam();
}